

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  int64 iVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var_00;
  LogMessage *pLVar5;
  int64 iVar6;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  int64 iVar8;
  undefined4 extraout_var_02;
  LogMessage local_90;
  string local_58;
  uint local_38;
  LogFinisher local_31;
  ulong value;
  ulong uVar7;
  
  iVar4 = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var_00,iVar4);
  if ((value & 0xffffffff80000000) == 0) {
    iVar6 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
    iVar1 = output->start_count_;
    iVar4 = (*this->_vptr_MessageLite[0xc])(this,output->cur_,output);
    output->cur_ = (uint8 *)CONCAT44(extraout_var_01,iVar4);
    bVar2 = io::CodedOutputStream::HadError(output);
    uVar7 = CONCAT71(extraout_var,bVar2);
    if (!bVar2) {
      local_38 = (uint)uVar7;
      iVar8 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
      uVar7 = (ulong)local_38;
      if (value != (long)(((int)iVar1 + (int)iVar8) - ((int)iVar6 + (int)output->start_count_))) {
        iVar4 = (*this->_vptr_MessageLite[9])(this);
        if (value != CONCAT44(extraout_var_02,iVar4)) {
          internal::LogMessage::LogMessage
                    (&local_90,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
                     ,0x54);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_90,
                              "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                             );
          (*this->_vptr_MessageLite[2])(&local_58,this);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_58);
          pLVar5 = internal::LogMessage::operator<<
                             (pLVar5," was modified concurrently during serialization.");
          internal::LogFinisher::operator=(&local_31,pLVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          internal::LogMessage::~LogMessage(&local_90);
        }
        internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
                   ,0x57);
        pLVar5 = internal::LogMessage::operator<<
                           (&local_90,
                            "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                           );
        pLVar5 = internal::LogMessage::operator<<
                           (pLVar5,
                            "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                           );
        (*this->_vptr_MessageLite[2])(&local_58,this);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_58);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,".");
        internal::LogFinisher::operator=(&local_31,pLVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        internal::LogMessage::~LogMessage(&local_90);
        internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
                   ,0x5c);
        pLVar5 = internal::LogMessage::operator<<
                           (&local_90,"This shouldn\'t be called if all the sizes are equal.");
        internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar5);
        internal::LogMessage::~LogMessage(&local_90);
        uVar7 = (ulong)local_38;
      }
    }
    bVar3 = (byte)uVar7 ^ 1;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
               ,0x17c);
    (*this->_vptr_MessageLite[2])(&local_58,this);
    pLVar5 = internal::LogMessage::operator<<(&local_90,&local_58);
    pLVar5 = internal::LogMessage::operator<<(pLVar5," exceeded maximum protobuf size of 2GB: ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,value);
    internal::LogFinisher::operator=(&local_31,pLVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    internal::LogMessage::~LogMessage(&local_90);
    bVar3 = 0;
  }
  return (bool)bVar3;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != size) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}